

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_minnow_byt_compatible.c
# Opt level: O1

mraa_result_t
mraa_intel_minnowboard_set_pininfo
          (mraa_board_t *board,int mraa_index,char *name,mraa_pincapabilities_t caps,int sysfs_pin,
          int chip,int line)

{
  mraa_pininfo_t *__dest;
  mraa_pininfo_t *pmVar1;
  mraa_result_t mVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ushort **ppuVar6;
  
  mVar2 = MRAA_ERROR_INVALID_RESOURCE;
  if (mraa_index < board->phy_pin_count) {
    pmVar1 = board->pins;
    __dest = pmVar1 + mraa_index;
    strncpy(__dest->name,name,8);
    *(char *)&pmVar1[mraa_index].capabilities = caps._0_1_;
    pmVar1[mraa_index].capabilities.field_0x3 = caps._3_1_;
    *(short *)&pmVar1[mraa_index].capabilities.field_0x1 = caps._1_2_;
    if (((uint)caps & 2) != 0) {
      (__dest->gpio).pinmap = sysfs_pin | arch_nr_gpios_adjust;
      (__dest->gpio).mux_total = 0;
      (__dest->gpio).gpio_chip = chip;
      (__dest->gpio).gpio_line = line;
    }
    if (((uint)caps & 0x20) != 0) {
      (__dest->i2c).pinmap = 1;
      (__dest->i2c).mux_total = 0;
    }
    if (((uint)caps & 4) != 0) {
      iVar3 = strncmp(name,"PWM",3);
      uVar4 = 0;
      if (iVar3 == 0) {
        sVar5 = strlen(name);
        uVar4 = 0;
        if (3 < sVar5) {
          ppuVar6 = __ctype_b_loc();
          uVar4 = 0;
          if ((*(byte *)((long)*ppuVar6 + (long)name[3] * 2 + 1) & 8) != 0) {
            uVar4 = (int)name[3] - 0x30;
          }
        }
      }
      (__dest->pwm).parent_id = uVar4;
      (__dest->pwm).pinmap = 0;
      (__dest->pwm).mux_total = 0;
    }
    mVar2 = MRAA_SUCCESS;
    if (((uint)caps & 0x10) != 0) {
      (__dest->spi).mux_total = 0;
    }
  }
  return mVar2;
}

Assistant:

mraa_result_t
mraa_intel_minnowboard_set_pininfo(mraa_board_t* board, int mraa_index, char* name, mraa_pincapabilities_t caps, int sysfs_pin, int chip, int line)
{
    if (mraa_index < board->phy_pin_count) {
        // adjust mraa_index for ARCH_NR_GPIOS value
        mraa_pininfo_t* pin_info = &board->pins[mraa_index];
        strncpy(pin_info->name, name, MAX_LENGTH);
        pin_info->capabilities = caps;
        if (caps.gpio) {
            pin_info->gpio.pinmap = sysfs_pin | arch_nr_gpios_adjust;
            pin_info->gpio.mux_total = 0;
            pin_info->gpio.gpio_chip = chip;
            pin_info->gpio.gpio_line = line;
        }
        if (caps.i2c) {
            pin_info->i2c.pinmap = 1;
            pin_info->i2c.mux_total = 0;
        }
        if (caps.pwm) {
            int controller = 0;
            if (strncmp(name, "PWM", 3) == 0 && strlen(name) > 3 && isdigit(name[3]))
                controller = name[3] - '0';
            pin_info->pwm.parent_id = (unsigned int) controller;
            pin_info->pwm.pinmap = 0;
            pin_info->pwm.mux_total = 0;
        }
        if (caps.spi) {
            pin_info->spi.mux_total = 0;
        }
        return MRAA_SUCCESS;
    }
    return MRAA_ERROR_INVALID_RESOURCE;
}